

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

Status * __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
EncodeConnectivity(Status *__return_storage_ptr__,
                  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this
                  )

{
  MeshEdgebreakerTraversalPredictiveEncoder *pMVar1;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *this_00;
  ulong *puVar2;
  CornerTable *pCVar3;
  pointer piVar4;
  pointer pTVar5;
  EncoderBuffer *pEVar6;
  _Bit_type *p_Var7;
  iterator __position;
  pointer pIVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  pointer pIVar12;
  uint uVar13;
  pointer pIVar14;
  uint uVar15;
  pointer pIVar16;
  CornerIndex CVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 *puVar20;
  CornerIndex CVar21;
  _Head_base<0UL,_draco::CornerTable_*,_false> _Var22;
  uint uVar23;
  pointer pIVar24;
  ulong uVar25;
  uint8_t num_attribute_data;
  CornerIndex start_corner;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  init_face_connectivity_corners;
  byte local_b1;
  _Head_base<0UL,_draco::CornerTable_*,_false> local_b0;
  long local_a8;
  undefined1 local_a0 [20];
  CornerIndex local_8c;
  Status *local_88;
  vector<bool,_std::allocator<bool>_> *local_80;
  CornerTable *local_78;
  iterator iStack_70;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  MeshEdgebreakerTraversalPredictiveEncoder *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_40;
  pointer local_38;
  
  if (this->use_single_connectivity_ == true) {
    CreateCornerTableFromAllAttributes((draco *)&local_b0,this->mesh_);
  }
  else {
    CreateCornerTableFromPositionAttribute((draco *)&local_b0,this->mesh_);
  }
  _Var22._M_head_impl = local_b0._M_head_impl;
  local_b0._M_head_impl = (CornerTable *)0x0;
  std::__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::reset
            ((__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             &this->corner_table_,_Var22._M_head_impl);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)&local_b0);
  pCVar3 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  if ((pCVar3 == (CornerTable *)0x0) ||
     (pCVar3->num_degenerated_faces_ ==
      (int)((ulong)((long)*(pointer *)((long)&(pCVar3->corner_to_vertex_map_).vector_ + 8) -
                    *(long *)&(pCVar3->corner_to_vertex_map_).vector_ >> 2) / 3))) {
    local_b0._M_head_impl = (CornerTable *)local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"All triangles are degenerate.","");
    __return_storage_ptr__->code_ = DRACO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_b0._M_head_impl,
               (undefined1 *)
               ((long)&((local_b0._M_head_impl)->corner_to_vertex_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_a8));
  }
  else {
    pMVar1 = &this->traversal_encoder_;
    MeshEdgebreakerTraversalPredictiveEncoder::Init
              (pMVar1,&this->super_MeshEdgebreakerEncoderImplInterface);
    pCVar3 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    EncodeVarint<unsigned_int>
              ((int)((ulong)((long)*(pointer *)((long)&(pCVar3->vertex_corners_).vector_ + 8) -
                            *(long *)&(pCVar3->vertex_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                            ) >> 2) - pCVar3->num_isolated_vertices_,
               (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
    pCVar3 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    EncodeVarint<unsigned_int>
              ((int)((ulong)((long)*(pointer *)((long)&(pCVar3->corner_to_vertex_map_).vector_ + 8)
                             - *(long *)&(pCVar3->corner_to_vertex_map_).vector_ >> 2) / 3) -
               pCVar3->num_degenerated_faces_,
               (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
    local_80 = &this->visited_faces_;
    std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
              (local_80,(ulong)(uint)((int)((ulong)((long)(this->mesh_->faces_).vector_.
                                                                                                                    
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->mesh_->faces_).vector_.
                                                                                                                
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                     -0x55555555),false);
    pCVar3 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    local_b0._M_head_impl._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&(this->pos_encoding_data_).vertex_to_encoded_attribute_value_index_map,
               (long)(int)((ulong)((long)*(pointer *)((long)&(pCVar3->vertex_corners_).vector_ + 8)
                                  - *(long *)&(pCVar3->vertex_corners_).vector_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  ) >> 2),(value_type_conflict1 *)&local_b0);
    pIVar16 = (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar16) {
      (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar16;
    }
    pCVar3 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::reserve(&(this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map,
              (long)((int)((ulong)((long)*(pointer *)
                                          ((long)&(pCVar3->corner_to_vertex_map_).vector_ + 8) -
                                   *(long *)&(pCVar3->corner_to_vertex_map_).vector_ >> 2) / 3) * 3)
             );
    pCVar3 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
              (&this->visited_vertex_ids_,
               (long)(int)((ulong)((long)*(pointer *)((long)&(pCVar3->vertex_corners_).vector_ + 8)
                                  - *(long *)&(pCVar3->vertex_corners_).vector_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  ) >> 2),false);
    piVar4 = (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar4) {
      (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar4;
    }
    this->last_encoded_symbol_id_ = -1;
    this->num_split_symbols_ = 0;
    pTVar5 = (this->topology_split_event_data_).
             super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->topology_split_event_data_).
        super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
        ._M_impl.super__Vector_impl_data._M_finish != pTVar5) {
      (this->topology_split_event_data_).
      super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar5;
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->face_to_split_symbol_map_)._M_h);
    pCVar3 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_b0._M_head_impl._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&this->vertex_hole_id_,
               (long)(int)((ulong)((long)*(pointer *)((long)&(pCVar3->vertex_corners_).vector_ + 8)
                                  - *(long *)&(pCVar3->vertex_corners_).vector_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  ) >> 2),(value_type_conflict1 *)&local_b0);
    this_00 = &this->processed_connectivity_corners_;
    pIVar16 = (this->processed_connectivity_corners_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->processed_connectivity_corners_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar16) {
      (this->processed_connectivity_corners_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar16;
    }
    pCVar3 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::reserve(this_00,(long)(int)((ulong)((long)*(pointer *)
                                                 ((long)&(pCVar3->corner_to_vertex_map_).vector_ + 8
                                                 ) -
                                          *(long *)&(pCVar3->corner_to_vertex_map_).vector_ >> 2) /
                                 3));
    (this->pos_encoding_data_).num_values = 0;
    bVar9 = FindHoles(this);
    if (bVar9) {
      bVar9 = InitAttributeData(this);
      if (bVar9) {
        local_b1 = (char)((uint)(*(int *)&(this->attribute_data_).
                                          super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                *(int *)&(this->attribute_data_).
                                         super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * '\x1b';
        pEVar6 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
        local_40 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)this_00;
        if (pEVar6->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar6,
                     (pEVar6->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_b1,&local_b0);
        }
        (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.num_attribute_data_ =
             (uint)local_b1;
        pCVar3 = (this->corner_table_)._M_t.
                 super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                 .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
        pIVar24 = (pointer)((ulong)((long)*(pointer *)
                                           ((long)&(pCVar3->corner_to_vertex_map_).vector_ + 8) -
                                   *(long *)&(pCVar3->corner_to_vertex_map_).vector_) >> 2);
        local_50 = pMVar1;
        MeshEdgebreakerTraversalEncoder::Start(&pMVar1->super_MeshEdgebreakerTraversalEncoder);
        local_78 = (CornerTable *)0x0;
        iStack_70._M_current = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)0x0;
        local_68 = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)0x0;
        local_88 = __return_storage_ptr__;
        local_38 = pIVar24;
        if (0 < (int)pIVar24) {
          local_48 = &this->vertex_traversal_length_;
          local_58 = (string *)&__return_storage_ptr__->error_msg_;
          local_60 = &(__return_storage_ptr__->error_msg_).field_2;
          uVar23 = 0;
          do {
            uVar18 = (ulong)uVar23 / 3;
            uVar25 = (ulong)uVar23 / 0xc0;
            bVar9 = false;
            if ((((local_80->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar25] >>
                  (uVar18 & 0x3f) & 1) == 0) &&
               (bVar10 = CornerTable::IsDegenerated
                                   ((this->corner_table_)._M_t.
                                    super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                    .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl
                                    ,(FaceIndex)(uVar23 / 3)), !bVar10)) {
              local_8c.value_ = 0;
              bVar9 = FindInitFaceConfiguration(this,(FaceIndex)(uVar23 / 3),&local_8c);
              RAnsBitEncoder::EncodeBit((RAnsBitEncoder *)local_50,bVar9);
              CVar17.value_ = local_8c.value_;
              uVar19 = (ulong)local_8c.value_;
              if (bVar9) {
                pCVar3 = (this->corner_table_)._M_t.
                         super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                         .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
                uVar13 = 0xffffffff;
                CVar21.value_ = local_8c.value_;
                if (local_8c.value_ != 0xffffffff) {
                  uVar13 = *(uint *)(*(long *)&(pCVar3->corner_to_vertex_map_).vector_ + uVar19 * 4)
                  ;
                  CVar21.value_ = local_8c.value_ - 2;
                  if (0x55555555 < (local_8c.value_ + 1) * -0x55555555) {
                    CVar21.value_ = local_8c.value_ + 1;
                  }
                }
                uVar11 = 0xffffffff;
                if (CVar21.value_ != 0xffffffff) {
                  uVar11 = *(uint *)(*(long *)&(pCVar3->corner_to_vertex_map_).vector_ +
                                    (ulong)CVar21.value_ * 4);
                }
                CVar21.value_ = local_8c.value_;
                if (local_8c.value_ != 0xffffffff) {
                  CVar21.value_ =
                       ((local_8c.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_8c.value_;
                }
                uVar15 = 0xffffffff;
                if (CVar21.value_ != 0xffffffff) {
                  uVar15 = *(uint *)(*(long *)&(pCVar3->corner_to_vertex_map_).vector_ +
                                    (ulong)CVar21.value_ * 4);
                }
                p_Var7 = (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>.
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                p_Var7[uVar13 >> 6] = p_Var7[uVar13 >> 6] | 1L << ((byte)uVar13 & 0x3f);
                p_Var7[uVar11 >> 6] = p_Var7[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
                p_Var7[uVar15 >> 6] = p_Var7[uVar15 >> 6] | 1L << ((byte)uVar15 & 0x3f);
                local_b0._M_head_impl._0_4_ = 1;
                __position._M_current =
                     (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (local_48,__position,(int *)&local_b0);
                }
                else {
                  *__position._M_current = 1;
                  (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
                puVar2 = (local_80->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + uVar25;
                *puVar2 = *puVar2 | 1L << ((byte)uVar18 & 0x3f);
                local_b0._M_head_impl._0_4_ = CVar17.value_;
                if (CVar17.value_ != 0xffffffff) {
                  local_b0._M_head_impl._0_4_ = CVar17.value_ - 2;
                  if (0x55555555 < (CVar17.value_ + 1) * -0x55555555) {
                    local_b0._M_head_impl._0_4_ = CVar17.value_ + 1;
                  }
                }
                if (iStack_70._M_current == local_68) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>
                            ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                              *)&local_78,iStack_70,
                             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&local_b0);
                }
                else {
                  (iStack_70._M_current)->value_ = local_b0._M_head_impl._0_4_;
                  iStack_70._M_current = iStack_70._M_current + 1;
                }
                if (CVar17.value_ != 0xffffffff) {
                  uVar19 = (ulong)(CVar17.value_ - 2);
                  if (0x55555555 < (CVar17.value_ + 1) * -0x55555555) {
                    uVar19 = (ulong)(CVar17.value_ + 1);
                  }
                }
                CVar17.value_ = (uint)uVar19;
                if (CVar17.value_ != 0xffffffff) {
                  CVar17.value_ =
                       *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                             .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                            _M_head_impl)->opposite_corners_).vector_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                + uVar19 * 4);
                }
                bVar9 = false;
                if (((CVar17.value_ != 0xffffffff) &&
                    (bVar9 = false,
                    (*(ulong *)((long)(local_80->super__Bvector_base<std::allocator<bool>_>)._M_impl
                                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p + (ulong)(CVar17.value_ / 0x18 & 0xfffffff8)) >>
                     ((ulong)CVar17.value_ / 3 & 0x3f) & 1) == 0)) &&
                   (bVar10 = EncodeConnectivityFromCorner(this,CVar17), !bVar10)) {
                  local_b0._M_head_impl = (CornerTable *)local_a0;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_b0,"Failed to encode mesh component.","");
                  local_88->code_ = DRACO_ERROR;
                  (local_88->error_msg_)._M_dataplus._M_p = (pointer)local_60;
                  std::__cxx11::string::_M_construct<char*>
                            (local_58,local_b0._M_head_impl,
                             (undefined1 *)
                             ((long)&((local_b0._M_head_impl)->corner_to_vertex_map_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_a8));
LAB_0013e1ee:
                  if (local_b0._M_head_impl != (CornerTable *)local_a0) {
                    operator_delete(local_b0._M_head_impl,(ulong)((long)(uint *)local_a0._0_8_ + 1))
                    ;
                  }
                  bVar9 = true;
                }
              }
              else {
                if (local_8c.value_ != 0xffffffff) {
                  CVar17.value_ = local_8c.value_ - 2;
                  if (0x55555555 < (local_8c.value_ + 1) * -0x55555555) {
                    CVar17.value_ = local_8c.value_ + 1;
                  }
                }
                EncodeHole(this,CVar17,true);
                bVar10 = EncodeConnectivityFromCorner(this,local_8c);
                bVar9 = false;
                if (!bVar10) {
                  local_b0._M_head_impl = (CornerTable *)local_a0;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_b0,"Failed to encode mesh component.","");
                  local_88->code_ = DRACO_ERROR;
                  (local_88->error_msg_)._M_dataplus._M_p = (pointer)local_60;
                  std::__cxx11::string::_M_construct<char*>
                            (local_58,local_b0._M_head_impl,
                             (undefined1 *)
                             ((long)&((local_b0._M_head_impl)->corner_to_vertex_map_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_a8));
                  goto LAB_0013e1ee;
                }
              }
            }
            __return_storage_ptr__ = local_88;
            if (bVar9) goto LAB_0013e587;
            uVar23 = uVar23 + 1;
          } while ((uint)local_38 != uVar23);
        }
        pIVar16 = (this->processed_connectivity_corners_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar8 = (this->processed_connectivity_corners_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pIVar14 = pIVar8 + -1;
        if (pIVar16 < pIVar14 && pIVar16 != pIVar8) {
          do {
            pIVar12 = pIVar16 + 1;
            uVar23 = pIVar16->value_;
            pIVar16->value_ = pIVar14->value_;
            pIVar14->value_ = uVar23;
            pIVar14 = pIVar14 + -1;
            pIVar16 = pIVar12;
          } while (pIVar12 < pIVar14);
        }
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>*,std::vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>>
                  (local_40,pIVar8,local_78,iStack_70._M_current);
        pMVar1 = local_50;
        if ((this->attribute_data_).
            super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->attribute_data_).
            super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
                    (local_80,(ulong)(uint)((int)((ulong)((long)(this->mesh_->faces_).vector_.
                                                                                                                                
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->mesh_->faces_).vector_.
                                                                                                                
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                           -0x55555555),false);
          pIVar8 = (this->processed_connectivity_corners_).
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pIVar16 = (this->processed_connectivity_corners_).
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pIVar16 != pIVar8;
              pIVar16 = pIVar16 + 1) {
            EncodeAttributeConnectivitiesOnFace(this,(CornerIndex)pIVar16->value_);
          }
        }
        MeshEdgebreakerTraversalPredictiveEncoder::Done(pMVar1);
        EncodeVarint<unsigned_int>
                  ((this->traversal_encoder_).num_symbols_,
                   (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
        __return_storage_ptr__ = local_88;
        EncodeVarint<unsigned_int>
                  (this->num_split_symbols_,
                   (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
        bVar9 = EncodeSplitData(this);
        if (bVar9) {
          pEVar6 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
          if (pEVar6->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar6,
                       (pEVar6->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.
                       traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       *(pointer *)
                        ((long)&(this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.
                                traversal_buffer_.buffer_.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data + 8));
          }
          __return_storage_ptr__->code_ = OK;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->error_msg_).field_2;
          (__return_storage_ptr__->error_msg_)._M_string_length = 0;
          (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
        }
        else {
          local_b0._M_head_impl = (CornerTable *)local_a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Failed to encode split data.","");
          __return_storage_ptr__->code_ = DRACO_ERROR;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->error_msg_).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->error_msg_,local_b0._M_head_impl,
                     (undefined1 *)
                     ((long)&((local_b0._M_head_impl)->corner_to_vertex_map_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_a8));
          if (local_b0._M_head_impl != (CornerTable *)local_a0) {
            operator_delete(local_b0._M_head_impl,(ulong)((long)(uint *)local_a0._0_8_ + 1));
          }
        }
LAB_0013e587:
        if (local_78 == (CornerTable *)0x0) {
          return __return_storage_ptr__;
        }
        puVar20 = (undefined1 *)((long)local_68 - (long)local_78);
        _Var22._M_head_impl = local_78;
        goto LAB_0013dd36;
      }
      local_b0._M_head_impl = (CornerTable *)local_a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Failed to initialize attribute data.","");
      __return_storage_ptr__->code_ = DRACO_ERROR;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->error_msg_,local_b0._M_head_impl,
                 (undefined1 *)
                 ((long)&((local_b0._M_head_impl)->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_a8));
    }
    else {
      local_b0._M_head_impl = (CornerTable *)local_a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Failed to process mesh holes.","");
      __return_storage_ptr__->code_ = DRACO_ERROR;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->error_msg_,local_b0._M_head_impl,
                 (undefined1 *)
                 ((long)&((local_b0._M_head_impl)->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_a8));
    }
  }
  if (local_b0._M_head_impl == (CornerTable *)local_a0) {
    return __return_storage_ptr__;
  }
  puVar20 = (undefined1 *)((long)(uint *)local_a0._0_8_ + 1);
  _Var22._M_head_impl = local_b0._M_head_impl;
LAB_0013dd36:
  operator_delete(_Var22._M_head_impl,(ulong)puVar20);
  return __return_storage_ptr__;
}

Assistant:

Status MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivity() {
  // To encode the mesh, we need face connectivity data stored in a corner
  // table. To compute the connectivity we must use indices associated with
  // POSITION attribute, because they define which edges can be connected
  // together, unless the option |use_single_connectivity_| is set in which case
  // we break the mesh along attribute seams and use the same connectivity for
  // all attributes.
  if (use_single_connectivity_) {
    corner_table_ = CreateCornerTableFromAllAttributes(mesh_);
  } else {
    corner_table_ = CreateCornerTableFromPositionAttribute(mesh_);
  }
  if (corner_table_ == nullptr ||
      corner_table_->num_faces() == corner_table_->NumDegeneratedFaces()) {
    // Failed to construct the corner table.
    // TODO(ostava): Add better error reporting.
    return Status(Status::DRACO_ERROR, "All triangles are degenerate.");
  }

  traversal_encoder_.Init(this);

  // Also encode the total number of vertices that is going to be encoded.
  // This can be different from the mesh_->num_points() + num_new_vertices,
  // because some of the vertices of the input mesh can be ignored (e.g.
  // vertices on degenerated faces or isolated vertices not attached to any
  // face).
  const uint32_t num_vertices_to_be_encoded =
      corner_table_->num_vertices() - corner_table_->NumIsolatedVertices();
  EncodeVarint(num_vertices_to_be_encoded, encoder_->buffer());

  const uint32_t num_faces =
      corner_table_->num_faces() - corner_table_->NumDegeneratedFaces();
  EncodeVarint(num_faces, encoder_->buffer());

  // Reset encoder data that may have been initialized in previous runs.
  visited_faces_.assign(mesh_->num_faces(), false);
  pos_encoding_data_.vertex_to_encoded_attribute_value_index_map.assign(
      corner_table_->num_vertices(), -1);
  pos_encoding_data_.encoded_attribute_value_index_to_corner_map.clear();
  pos_encoding_data_.encoded_attribute_value_index_to_corner_map.reserve(
      corner_table_->num_faces() * 3);
  visited_vertex_ids_.assign(corner_table_->num_vertices(), false);
  vertex_traversal_length_.clear();
  last_encoded_symbol_id_ = -1;
  num_split_symbols_ = 0;
  topology_split_event_data_.clear();
  face_to_split_symbol_map_.clear();
  visited_holes_.clear();
  vertex_hole_id_.assign(corner_table_->num_vertices(), -1);
  processed_connectivity_corners_.clear();
  processed_connectivity_corners_.reserve(corner_table_->num_faces());
  pos_encoding_data_.num_values = 0;

  if (!FindHoles()) {
    return Status(Status::DRACO_ERROR, "Failed to process mesh holes.");
  }

  if (!InitAttributeData()) {
    return Status(Status::DRACO_ERROR, "Failed to initialize attribute data.");
  }

  const uint8_t num_attribute_data =
      static_cast<uint8_t>(attribute_data_.size());
  encoder_->buffer()->Encode(num_attribute_data);
  traversal_encoder_.SetNumAttributeData(num_attribute_data);

  const int num_corners = corner_table_->num_corners();

  traversal_encoder_.Start();

  std::vector<CornerIndex> init_face_connectivity_corners;
  // Traverse the surface starting from each unvisited corner.
  for (int c_id = 0; c_id < num_corners; ++c_id) {
    CornerIndex corner_index(c_id);
    const FaceIndex face_id = corner_table_->Face(corner_index);
    if (visited_faces_[face_id.value()]) {
      continue;  // Face has been already processed.
    }
    if (corner_table_->IsDegenerated(face_id)) {
      continue;  // Ignore degenerated faces.
    }

    CornerIndex start_corner;
    const bool interior_config =
        FindInitFaceConfiguration(face_id, &start_corner);
    traversal_encoder_.EncodeStartFaceConfiguration(interior_config);

    if (interior_config) {
      // Select the correct vertex on the face as the root.
      corner_index = start_corner;
      const VertexIndex vert_id = corner_table_->Vertex(corner_index);
      // Mark all vertices of a given face as visited.
      const VertexIndex next_vert_id =
          corner_table_->Vertex(corner_table_->Next(corner_index));
      const VertexIndex prev_vert_id =
          corner_table_->Vertex(corner_table_->Previous(corner_index));

      visited_vertex_ids_[vert_id.value()] = true;
      visited_vertex_ids_[next_vert_id.value()] = true;
      visited_vertex_ids_[prev_vert_id.value()] = true;
      // New traversal started. Initiate it's length with the first vertex.
      vertex_traversal_length_.push_back(1);

      // Mark the face as visited.
      visited_faces_[face_id.value()] = true;
      // Start compressing from the opposite face of the "next" corner. This way
      // the first encoded corner corresponds to the tip corner of the regular
      // edgebreaker traversal (essentially the initial face can be then viewed
      // as a TOPOLOGY_C face).
      init_face_connectivity_corners.push_back(
          corner_table_->Next(corner_index));
      const CornerIndex opp_id =
          corner_table_->Opposite(corner_table_->Next(corner_index));
      const FaceIndex opp_face_id = corner_table_->Face(opp_id);
      if (opp_face_id != kInvalidFaceIndex &&
          !visited_faces_[opp_face_id.value()]) {
        if (!EncodeConnectivityFromCorner(opp_id)) {
          return Status(Status::DRACO_ERROR,
                        "Failed to encode mesh component.");
        }
      }
    } else {
      // Boundary configuration. We start on a boundary rather than on a face.
      // First encode the hole that's opposite to the start_corner.
      EncodeHole(corner_table_->Next(start_corner), true);
      // Start processing the face opposite to the boundary edge (the face
      // containing the start_corner).
      if (!EncodeConnectivityFromCorner(start_corner)) {
        return Status(Status::DRACO_ERROR, "Failed to encode mesh component.");
      }
    }
  }
  // Reverse the order of connectivity corners to match the order in which
  // they are going to be decoded.
  std::reverse(processed_connectivity_corners_.begin(),
               processed_connectivity_corners_.end());
  // Append the init face connectivity corners (which are processed in order by
  // the decoder after the regular corners.
  processed_connectivity_corners_.insert(processed_connectivity_corners_.end(),
                                         init_face_connectivity_corners.begin(),
                                         init_face_connectivity_corners.end());
  // Encode connectivity for all non-position attributes.
  if (!attribute_data_.empty()) {
    // Use the same order of corner that will be used by the decoder.
    visited_faces_.assign(mesh_->num_faces(), false);
    for (CornerIndex ci : processed_connectivity_corners_) {
      EncodeAttributeConnectivitiesOnFace(ci);
    }
  }
  traversal_encoder_.Done();

  // Encode the number of symbols.
  const uint32_t num_encoded_symbols =
      static_cast<uint32_t>(traversal_encoder_.NumEncodedSymbols());
  EncodeVarint(num_encoded_symbols, encoder_->buffer());

  // Encode the number of split symbols.
  EncodeVarint(num_split_symbols_, encoder_->buffer());

  // Append the traversal buffer.
  if (!EncodeSplitData()) {
    return Status(Status::DRACO_ERROR, "Failed to encode split data.");
  }
  encoder_->buffer()->Encode(traversal_encoder_.buffer().data(),
                             traversal_encoder_.buffer().size());

  return OkStatus();
}